

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O3

Transform * __thiscall sf::View::getTransform(View *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Transform local_50;
  
  if (this->m_transformUpdated == false) {
    fVar2 = (this->m_rotation * 3.1415927) / 180.0;
    fVar3 = cosf(fVar2);
    fVar4 = sinf(fVar2);
    fVar2 = (this->m_center).x;
    fVar1 = (this->m_center).y;
    fVar6 = -2.0 / (this->m_size).y;
    fVar5 = 2.0 / (this->m_size).x;
    Transform::Transform
              (&local_50,fVar3 * fVar5,fVar4 * fVar5,
               fVar5 * ((-fVar2 * fVar3 - fVar4 * fVar1) + fVar2) - fVar2 * fVar5,-fVar6 * fVar4,
               fVar3 * fVar6,fVar6 * ((fVar2 * fVar4 - fVar3 * fVar1) + fVar1) - fVar1 * fVar6,0.0,
               0.0,1.0);
    *(undefined8 *)((this->m_transform).m_matrix + 0xc) = local_50.m_matrix._48_8_;
    *(undefined8 *)((this->m_transform).m_matrix + 0xe) = local_50.m_matrix._56_8_;
    *(undefined8 *)((this->m_transform).m_matrix + 8) = local_50.m_matrix._32_8_;
    *(undefined8 *)((this->m_transform).m_matrix + 10) = local_50.m_matrix._40_8_;
    *(undefined8 *)((this->m_transform).m_matrix + 4) = local_50.m_matrix._16_8_;
    *(undefined8 *)((this->m_transform).m_matrix + 6) = local_50.m_matrix._24_8_;
    *(undefined8 *)(this->m_transform).m_matrix = local_50.m_matrix._0_8_;
    *(undefined8 *)((this->m_transform).m_matrix + 2) = local_50.m_matrix._8_8_;
    this->m_transformUpdated = true;
  }
  return &this->m_transform;
}

Assistant:

const Transform& View::getTransform() const
{
    // Recompute the matrix if needed
    if (!m_transformUpdated)
    {
        // Rotation components
        float angle  = m_rotation * 3.141592654f / 180.f;
        float cosine = std::cos(angle);
        float sine   = std::sin(angle);
        float tx     = -m_center.x * cosine - m_center.y * sine + m_center.x;
        float ty     =  m_center.x * sine - m_center.y * cosine + m_center.y;

        // Projection components
        float a =  2.f / m_size.x;
        float b = -2.f / m_size.y;
        float c = -a * m_center.x;
        float d = -b * m_center.y;

        // Rebuild the projection matrix
        m_transform = Transform( a * cosine, a * sine,   a * tx + c,
                                -b * sine,   b * cosine, b * ty + d,
                                 0.f,        0.f,        1.f);
        m_transformUpdated = true;
    }

    return m_transform;
}